

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

void __thiscall
pbrt::FilmHandle::WriteImage(FilmHandle *this,ImageMetadata *metadata,Float splatScale)

{
  ulong uVar1;
  RGBFilm *this_00;
  ImageMetadata local_110;
  
  uVar1 = (this->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits;
  this_00 = (RGBFilm *)(uVar1 & 0xffffffffffff);
  if (uVar1 >> 0x31 == 0) {
    ImageMetadata::ImageMetadata(&local_110,metadata);
    RGBFilm::WriteImage(this_00,&local_110,splatScale);
  }
  else {
    ImageMetadata::ImageMetadata(&local_110,metadata);
    GBufferFilm::WriteImage((GBufferFilm *)this_00,&local_110,splatScale);
  }
  ImageMetadata::~ImageMetadata(&local_110);
  return;
}

Assistant:

void FilmHandle::WriteImage(ImageMetadata metadata, Float splatScale) {
    auto write = [&](auto ptr) { return ptr->WriteImage(metadata, splatScale); };
    return DispatchCPU(write);
}